

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.cc
# Opt level: O0

undefined8 to_string<double>(double *x)

{
  double *in_RSI;
  undefined8 in_RDI;
  ostringstream temp;
  ostringstream local_188 [376];
  double *local_10;
  
  local_10 = in_RSI;
  std::__cxx11::ostringstream::ostringstream(local_188);
  std::ostream::operator<<((ostream *)local_188,*local_10);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_188);
  return in_RDI;
}

Assistant:

std::string to_string(const T &x) {
  std::ostringstream temp;
  temp << x;
  return temp.str();
}